

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O2

data_ptr_t __thiscall
duckdb::TupleDataAllocator::GetBaseHeapPointer
          (TupleDataAllocator *this,TupleDataPinState *pin_state,TupleDataChunkPart *part)

{
  BufferHandle *this_00;
  data_ptr_t pdVar1;
  
  this_00 = PinHeapBlock(this,pin_state,part);
  pdVar1 = BufferHandle::Ptr(this_00);
  return pdVar1;
}

Assistant:

data_ptr_t TupleDataAllocator::GetBaseHeapPointer(TupleDataPinState &pin_state, const TupleDataChunkPart &part) {
	return PinHeapBlock(pin_state, part).Ptr();
}